

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O0

void __thiscall
S2ClosestEdgeQueryBase<S2MinDistance>::InitCovering(S2ClosestEdgeQueryBase<S2MinDistance> *this)

{
  bool bVar1;
  S2CellId SVar2;
  S2CellId SVar3;
  Iterator local_b0;
  Iterator cell_last;
  Iterator local_98;
  Iterator cell_first;
  S2CellId local_70;
  S2CellId local_68;
  S2CellId id;
  S2CellId last_id;
  S2CellId local_48;
  int local_40;
  S2CellId SStack_3c;
  int level;
  S2CellId local_34;
  Iterator local_20;
  Iterator last;
  Iterator next;
  S2ClosestEdgeQueryBase<S2MinDistance> *this_local;
  
  std::vector<S2CellId,_std::allocator<S2CellId>_>::reserve(&this->index_covering_,6);
  S2ShapeIndex::Iterator::Iterator(&last,this->index_,BEGIN);
  S2ShapeIndex::Iterator::Iterator(&local_20,this->index_,END);
  S2ShapeIndex::Iterator::Prev(&local_20);
  local_34 = S2ShapeIndex::Iterator::id(&last);
  SStack_3c = S2ShapeIndex::Iterator::id(&local_20);
  bVar1 = ::operator!=(local_34,SStack_3c);
  if (bVar1) {
    local_48 = S2ShapeIndex::Iterator::id(&last);
    SVar2 = S2ShapeIndex::Iterator::id(&local_20);
    local_40 = S2CellId::GetCommonAncestorLevel(&local_48,SVar2);
    local_40 = local_40 + 1;
    id = S2ShapeIndex::Iterator::id(&local_20);
    SVar2 = S2CellId::parent(&id,local_40);
    local_70 = S2ShapeIndex::Iterator::id(&last);
    local_68 = S2CellId::parent(&local_70,local_40);
    while (bVar1 = ::operator!=(local_68,SVar2), bVar1) {
      SVar3 = S2CellId::range_max(&local_68);
      cell_first.iter_._M_t.
      super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
      ._M_t.
      super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
      .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl =
           (unique_ptr<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
           )S2ShapeIndex::Iterator::id(&last);
      bVar1 = ::operator<(SVar3,(S2CellId)
                                cell_first.iter_._M_t.
                                super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
                                .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>.
                                _M_head_impl);
      if (!bVar1) {
        S2ShapeIndex::Iterator::Iterator(&local_98,&last);
        cell_last.iter_._M_t.
        super___uniq_ptr_impl<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
        ._M_t.
        super__Tuple_impl<0UL,_S2ShapeIndex::IteratorBase_*,_std::default_delete<S2ShapeIndex::IteratorBase>_>
        .super__Head_base<0UL,_S2ShapeIndex::IteratorBase_*,_false>._M_head_impl =
             (unique_ptr<S2ShapeIndex::IteratorBase,_std::default_delete<S2ShapeIndex::IteratorBase>_>
              )S2CellId::range_max(&local_68);
        SVar3 = S2CellId::next((S2CellId *)&cell_last);
        S2ShapeIndex::Iterator::Seek(&last,SVar3);
        S2ShapeIndex::Iterator::Iterator(&local_b0,&last);
        S2ShapeIndex::Iterator::Prev(&local_b0);
        AddInitialRange(this,&local_98,&local_b0);
        S2ShapeIndex::Iterator::~Iterator(&local_b0);
        S2ShapeIndex::Iterator::~Iterator(&local_98);
      }
      local_68 = S2CellId::next(&local_68);
    }
  }
  AddInitialRange(this,&last,&local_20);
  S2ShapeIndex::Iterator::~Iterator(&local_20);
  S2ShapeIndex::Iterator::~Iterator(&last);
  return;
}

Assistant:

void S2ClosestEdgeQueryBase<Distance>::InitCovering() {
  // Find the range of S2Cells spanned by the index and choose a level such
  // that the entire index can be covered with just a few cells.  These are
  // the "top-level" cells.  There are two cases:
  //
  //  - If the index spans more than one face, then there is one top-level cell
  // per spanned face, just big enough to cover the index cells on that face.
  //
  //  - If the index spans only one face, then we find the smallest cell "C"
  // that covers the index cells on that face (just like the case above).
  // Then for each of the 4 children of "C", if the child contains any index
  // cells then we create a top-level cell that is big enough to just fit
  // those index cells (i.e., shrinking the child as much as possible to fit
  // its contents).  This essentially replicates what would happen if we
  // started with "C" as the top-level cell, since "C" would immediately be
  // split, except that we take the time to prune the children further since
  // this will save work on every subsequent query.

  // Don't need to reserve index_cells_ since it is an InlinedVector.
  index_covering_.reserve(6);

  // TODO(ericv): Use a single iterator (iter_) below and save position
  // information using pair<S2CellId, const S2ShapeIndexCell*> type.
  S2ShapeIndex::Iterator next(index_, S2ShapeIndex::BEGIN);
  S2ShapeIndex::Iterator last(index_, S2ShapeIndex::END);
  last.Prev();
  if (next.id() != last.id()) {
    // The index has at least two cells.  Choose a level such that the entire
    // index can be spanned with at most 6 cells (if the index spans multiple
    // faces) or 4 cells (it the index spans a single face).
    int level = next.id().GetCommonAncestorLevel(last.id()) + 1;

    // Visit each potential top-level cell except the last (handled below).
    S2CellId last_id = last.id().parent(level);
    for (S2CellId id = next.id().parent(level); id != last_id; id = id.next()) {
      // Skip any top-level cells that don't contain any index cells.
      if (id.range_max() < next.id()) continue;

      // Find the range of index cells contained by this top-level cell and
      // then shrink the cell if necessary so that it just covers them.
      S2ShapeIndex::Iterator cell_first = next;
      next.Seek(id.range_max().next());
      S2ShapeIndex::Iterator cell_last = next;
      cell_last.Prev();
      AddInitialRange(cell_first, cell_last);
    }
  }
  AddInitialRange(next, last);
}